

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O0

void __thiscall
CQueue::AddToQueue<void(*)(area_data*,std::__cxx11::string),area_data*&,char_const(&)[89]>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_void_area_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          *func,area_data **args,char (*args_1) [89])

{
  string_view fmt;
  string_view fmt_00;
  string *in_RCX;
  string *in_RDX;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  function<void_()> *in_stack_00000008;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  tuple<area_data_*&,_const_char_(&)[89]> tuple;
  value_type *in_stack_fffffffffffffe18;
  tuple<area_data_*&,_const_char_(&)[89]> *in_stack_fffffffffffffe20;
  queueEntry_t *this_00;
  char *in_stack_fffffffffffffe28;
  anon_class_112_3_3bdf3dc2 *__f;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe30;
  long local_1c8;
  tuple<area_data_*&,_const_char_(&)[89]> *in_stack_fffffffffffffe40;
  CQueue *in_stack_fffffffffffffe48;
  unsigned_long *in_stack_fffffffffffffe50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *args_2;
  CLogger *in_stack_fffffffffffffe58;
  size_t in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  anon_class_112_3_3bdf3dc2 aStack_160;
  int local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8 [56];
  queueEntry_t qStack_90;
  int local_c;
  
  local_c = in_ESI;
  if (in_ESI < 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    qStack_90.charList.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x2;
    fmt._M_str = (char *)in_RCX;
    fmt._M_len = in_stack_fffffffffffffe60;
    CLogger::Warn<unsigned_long>(in_stack_fffffffffffffe58,fmt,in_stack_fffffffffffffe50);
  }
  args_2 = &qStack_90.calleeFuncName.field_2;
  std::tuple<area_data_*&,_const_char_(&)[89]>::tuple<true,_true>
            (in_stack_fffffffffffffe20,(area_data **)in_stack_fffffffffffffe18,
             (char (*) [89])0x6c11f5);
  GetCharacterData<area_data*&,char_const(&)[89]>
            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  local_f0 = local_c;
  args_00 = &local_e8;
  pbVar1 = in_RDI;
  std::__cxx11::string::string((string *)args_00,in_RDX);
  std::__cxx11::string::string(local_c8,in_RCX);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector
            ((vector<char_data_*,_std::allocator<char_data_*>_> *)in_RDX,
             (vector<char_data_*,_std::allocator<char_data_*>_> *)in_RCX);
  this_00 = &qStack_90;
  __f = &aStack_160;
  local_1c8 = 0;
  do {
    *(char *)((long)&__f->func + local_1c8) =
         (in_stack_00000008->super__Function_base)._M_functor._M_pod_data[local_1c8];
    local_1c8 = local_1c8 + 1;
  } while (local_1c8 != 0x59);
  std::function<void()>::
  function<CQueue::AddToQueue<void(*)(area_data*,std::__cxx11::string),area_data*&,char_const(&)[89]>(int,std::__cxx11::string,std::__cxx11::string,void(*)(area_data*,std::__cxx11::string),area_data*&,char_const(&)[89])::_lambda()_1_,void>
            (in_stack_00000008,__f);
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::push_back
            ((vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_> *)this_00,
             in_stack_fffffffffffffe18);
  queueEntry_t::~queueEntry_t(this_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_00000008,(char *)__f);
  fmt_00._M_str = (char *)pbVar1;
  fmt_00._M_len = (size_t)in_RDX;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            ((CLogger *)in_RCX,fmt_00,args_00,in_RDI,(int *)args_2->_M_local_buf);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::~vector
            ((vector<char_data_*,_std::allocator<char_data_*>_> *)in_stack_00000008);
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}